

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O3

void Ptex::v2_4::PtexUtils::interleave
               (void *src,int sstride,int uw,int vw,void *dst,int dstride,DataType dt,int nchan)

{
  undefined1 *puVar1;
  undefined2 *puVar2;
  undefined4 *puVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  int iVar7;
  long lVar8;
  undefined2 *puVar9;
  undefined4 *puVar10;
  undefined1 *puVar11;
  undefined1 *puVar12;
  undefined2 *puVar13;
  undefined4 *puVar14;
  
  if (dt - dt_uint16 < 2) {
    if (nchan != 0) {
      puVar2 = (undefined2 *)((long)dst + (long)nchan * 2);
      iVar4 = vw * (sstride / 2);
      do {
        pvVar6 = src;
        if (iVar4 != 0) {
          pvVar6 = (void *)((long)src + (long)iVar4 * 2);
          puVar13 = (undefined2 *)dst;
          do {
            if (uw != 0) {
              lVar8 = 0;
              puVar9 = puVar13;
              do {
                *puVar9 = *(undefined2 *)((long)src + lVar8);
                lVar8 = lVar8 + 2;
                puVar9 = puVar9 + nchan;
              } while ((long)uw * 2 != lVar8);
            }
            src = (void *)((long)src + (long)(sstride / 2) * 2);
            puVar13 = puVar13 + dstride / 2;
          } while (src != pvVar6);
        }
        dst = (void *)((long)dst + 2);
        src = pvVar6;
      } while ((undefined2 *)dst != puVar2);
    }
  }
  else if (dt == dt_float) {
    if (nchan != 0) {
      iVar4 = dstride + 3;
      if (-1 < dstride) {
        iVar4 = dstride;
      }
      puVar3 = (undefined4 *)((long)dst + (long)nchan * 4);
      iVar7 = sstride + 3;
      if (-1 < sstride) {
        iVar7 = sstride;
      }
      iVar5 = vw * (iVar7 >> 2);
      do {
        pvVar6 = src;
        if (iVar5 != 0) {
          pvVar6 = (void *)((long)src + (long)iVar5 * 4);
          puVar14 = (undefined4 *)dst;
          do {
            if (uw != 0) {
              lVar8 = 0;
              puVar10 = puVar14;
              do {
                *puVar10 = *(undefined4 *)((long)src + lVar8);
                lVar8 = lVar8 + 4;
                puVar10 = puVar10 + nchan;
              } while ((long)uw * 4 != lVar8);
            }
            src = (void *)((long)src + (long)(iVar7 >> 2) * 4);
            puVar14 = puVar14 + (iVar4 >> 2);
          } while (src != pvVar6);
        }
        dst = (void *)((long)dst + 4);
        src = pvVar6;
      } while ((undefined4 *)dst != puVar3);
    }
  }
  else if ((dt == dt_uint8) && (nchan != 0)) {
    puVar1 = (undefined1 *)((long)dst + (long)nchan);
    do {
      pvVar6 = src;
      if (vw * sstride != 0) {
        pvVar6 = (void *)((long)src + (long)(vw * sstride));
        puVar12 = (undefined1 *)dst;
        do {
          if (uw != 0) {
            lVar8 = 0;
            puVar11 = puVar12;
            do {
              *puVar11 = *(undefined1 *)((long)src + lVar8);
              puVar11 = puVar11 + nchan;
              lVar8 = lVar8 + 1;
            } while (uw != lVar8);
          }
          src = (void *)((long)src + (long)sstride);
          puVar12 = puVar12 + dstride;
        } while (src != pvVar6);
      }
      dst = (void *)((long)dst + 1);
      src = pvVar6;
    } while ((undefined1 *)dst != puVar1);
  }
  return;
}

Assistant:

void interleave(const void* src, int sstride, int uw, int vw,
                void* dst, int dstride, DataType dt, int nchan)
{
    switch (dt) {
    case dt_uint8:     interleave((const uint8_t*) src, sstride, uw, vw,
                                  (uint8_t*) dst, dstride, nchan); break;
    case dt_half:
    case dt_uint16:    interleave((const uint16_t*) src, sstride, uw, vw,
                                  (uint16_t*) dst, dstride, nchan); break;
    case dt_float:     interleave((const float*) src, sstride, uw, vw,
                                  (float*) dst, dstride, nchan); break;
    }
}